

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6c0bae::HKDFTest_TestVectors_Test::TestBody(HKDFTest_TestVectors_Test *this)

{
  uint8_t *info;
  AssertHelperData *out_len;
  int iVar1;
  EVP_MD *pEVar2;
  EVP_PKEY_CTX *pEVar3;
  AssertHelper *pAVar4;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> _Var5;
  AssertHelperData *pAVar6;
  ScopedTrace *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar7;
  uint8_t *puVar8;
  long lVar9;
  pointer *__ptr;
  long lVar10;
  ulong info_len;
  bool bVar11;
  bool bVar12;
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY_CTX> copy;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_335;
  ScopedTrace gtest_trace_289;
  ScopedTrace gtest_trace_257;
  UniquePtr<EVP_PKEY_CTX> ctx;
  size_t len;
  bool copy_ctx;
  size_t prk_len;
  uint8_t buf [82];
  uint8_t prk [64];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b8;
  AssertHelperData *local_1b0;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> local_1a8;
  Bytes local_1a0;
  undefined1 local_190 [8];
  AssertHelperData *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  ScopedTrace local_16b;
  ScopedTrace local_16a;
  ScopedTrace local_169;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> local_168;
  AssertHelper local_160;
  undefined2 local_152;
  AssertHelperData *local_150;
  AssertHelper local_148;
  size_t local_140;
  code *local_138;
  unsigned_long local_130;
  uint8_t *local_128;
  AssertHelperData *local_120;
  uint8_t *local_118;
  size_t local_110;
  size_t local_108;
  uint8_t *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  AssertHelperData local_88;
  undefined8 uStack_50;
  AssertHelperData *local_40;
  AssertHelperData *local_38;
  
  local_130 = 0;
LAB_00306c21:
  this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_188;
  testing::ScopedTrace::ScopedTrace<unsigned_long>
            (&local_169,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
             ,0x101,&local_130);
  lVar9 = local_130 * 0x1b8;
  local_138 = (code *)(&(anonymous_namespace)::kTests)[local_130 * 0x37];
  pEVar2 = (EVP_MD *)(*local_138)();
  local_100 = &UNK_00700708 + lVar9;
  local_108 = *(size_t *)(&DAT_00700758 + lVar9);
  local_110 = *(size_t *)(&DAT_007007b0 + lVar9);
  puVar8 = &UNK_00700760 + lVar9;
  local_118 = puVar8;
  iVar1 = HKDF_extract((uint8_t *)&local_88,(size_t *)&local_150,pEVar2,local_100,local_108,puVar8,
                       local_110);
  local_190[0] = (internal)(iVar1 != 0);
  local_188 = (AssertHelperData *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_190,
               (AssertionResult *)
               "HKDF_extract(prk, &prk_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len)"
               ,"false","true",(char *)puVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x107,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
    }
    pAVar6 = local_188;
    if (local_188 == (AssertHelperData *)0x0) goto LAB_00307fbc;
LAB_00308201:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar6
                );
    goto LAB_00307fbc;
  }
  local_190 = (undefined1  [8])((long)&DAT_00700810 + lVar9);
  pAVar6 = *(AssertHelperData **)(&DAT_00700850 + lVar9);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88;
  local_1b0 = local_150;
  local_188 = pAVar6;
  local_f0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_e8,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
             (Bytes *)local_190,(Bytes *)&local_1b8);
  if (local_e8[0] == kSuccess) {
    testing::Message::Message((Message *)local_190);
    pcVar7 = "";
    if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = (pbStack_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x108,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b8);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_190 + 8))();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  out_len = *(AssertHelperData **)(&DAT_00700858 + lVar9);
  pEVar2 = (EVP_MD *)(*local_138)();
  puVar8 = &UNK_007007b8 + lVar9;
  local_140 = *(size_t *)(&DAT_00700808 + lVar9);
  local_128 = puVar8;
  iVar1 = HKDF_expand((uint8_t *)local_e8,(size_t)out_len,pEVar2,(uint8_t *)&local_88,
                      (size_t)local_150,puVar8,local_140);
  local_1b8._M_head_impl._0_1_ = iVar1 != 0;
  local_1b0 = (AssertHelperData *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_190,(internal *)&local_1b8,
               (AssertionResult *)
               "HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len, test->info, test->info_len)"
               ,"false","true",(char *)puVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x10c,(char *)local_190);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a0);
LAB_003081b8:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_190 != (undefined1  [8])&local_180) {
      operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
    }
    if ((AssertHelperData *)local_1a0.span_.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
    }
    if (local_1b0 == (AssertHelperData *)0x0) goto LAB_00307fbc;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1b0;
    pAVar6 = local_1b0;
    goto LAB_00308201;
  }
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (&DAT_00700860 + lVar9);
  local_1b0 = out_len;
  local_1a0.span_.data_ = (uchar *)local_e8;
  local_1a0.span_.size_ = (size_t)out_len;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1b8._M_head_impl;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_190,"Bytes(test->out, test->out_len)","Bytes(buf, test->out_len)",
             (Bytes *)&local_1b8,&local_1a0);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    pcVar7 = "";
    if (local_188 != (AssertHelperData *)0x0) {
      pcVar7 = *(char **)local_188;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x10d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
    }
  }
  if (local_188 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  }
  pEVar2 = (EVP_MD *)(*local_138)();
  puVar8 = local_118;
  iVar1 = HKDF((uint8_t *)local_e8,(size_t)out_len,pEVar2,local_100,local_108,local_118,local_110,
               local_128,local_140);
  local_1b8._M_head_impl._0_1_ = iVar1 != 0;
  local_1b0 = (AssertHelperData *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_190,(internal *)&local_1b8,
               (AssertionResult *)
               "HKDF(buf, test->out_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len, test->info, test->info_len)"
               ,"false","true",(char *)puVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x111,(char *)local_190);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a0);
    goto LAB_003081b8;
  }
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  local_1b0 = out_len;
  local_1a0.span_.data_ = (uchar *)local_e8;
  local_1a0.span_.size_ = (size_t)out_len;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_190,"Bytes(test->out, test->out_len)","Bytes(buf, test->out_len)",
             (Bytes *)&local_1b8,&local_1a0);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    pcVar7 = "";
    if (local_188 != (AssertHelperData *)0x0) {
      pcVar7 = *(char **)local_188;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x112,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
    }
  }
  if (local_188 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  }
  local_168._M_head_impl = (evp_pkey_ctx_st *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
  local_1b8._M_head_impl._0_1_ = local_168._M_head_impl != (EVP_PKEY_CTX *)0x0;
  local_1b0 = (AssertHelperData *)0x0;
  if (local_168._M_head_impl == (EVP_PKEY_CTX *)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_190,(internal *)&local_1b8,(AssertionResult *)0x5423a5,"false","true"
               ,(char *)puVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x117,(char *)local_190);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0);
  }
  else {
    iVar1 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_168._M_head_impl);
    local_1b8._M_head_impl._0_1_ = iVar1 != 0;
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_190,(internal *)&local_1b8,
                 (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",(char *)puVar8)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x118,(char *)local_190);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0);
    }
    else {
      iVar1 = EVP_PKEY_CTX_hkdf_mode(local_168._M_head_impl,1);
      _Var5._M_head_impl = local_168._M_head_impl;
      local_1b8._M_head_impl._0_1_ = iVar1 != 0;
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_190,(internal *)&local_1b8,
                   (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 1)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x11a,(char *)local_190);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0)
        ;
      }
      else {
        pEVar2 = (EVP_MD *)(*local_138)();
        iVar1 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar2);
        local_1b8._M_head_impl._0_1_ = iVar1 != 0;
        local_1b0 = (AssertHelperData *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_190,(internal *)&local_1b8,
                     (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                     "false","true",(char *)puVar8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x11b,(char *)local_190);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
        }
        else {
          iVar1 = EVP_PKEY_CTX_set1_hkdf_key(local_168._M_head_impl,local_100,local_108);
          local_1b8._M_head_impl._0_1_ = iVar1 != 0;
          local_1b0 = (AssertHelperData *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_1a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_190,(internal *)&local_1b8,
                       (AssertionResult *)
                       "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false",
                       "true",(char *)puVar8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x11d,(char *)local_190);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
          }
          else {
            iVar1 = EVP_PKEY_CTX_set1_hkdf_salt(local_168._M_head_impl,local_118,local_110);
            local_1b8._M_head_impl._0_1_ = iVar1 != 0;
            local_1b0 = (AssertHelperData *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_1a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_190,(internal *)&local_1b8,
                         (AssertionResult *)
                         "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)",
                         "false","true",(char *)puVar8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                         ,0x11f,(char *)local_190);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
            }
            else {
              local_148.data_._0_2_ = 0x100;
              local_38 = (AssertHelperData *)((long)&pAVar6[-1].message.field_2 + 0xf);
              local_40 = (AssertHelperData *)((long)&((_Alloc_hider *)&pAVar6->type)->_M_p + 1);
              lVar10 = 0;
              local_120 = out_len;
              do {
                local_152 = CONCAT11(local_152._1_1_,
                                     *(undefined1 *)((long)&local_148.data_ + lVar10));
                testing::ScopedTrace::ScopedTrace<bool>
                          (&local_16a,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                           ,0x121,(bool *)&local_152);
                local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
                _Var5._M_head_impl = local_168._M_head_impl;
                if (local_152._0_1_ == true) {
                  pEVar3 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_168._M_head_impl);
                  _Var5._M_head_impl = local_1a8._M_head_impl;
                  bVar11 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                  local_1a8._M_head_impl = pEVar3;
                  if (bVar11) {
                    EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
                  }
                  local_1b8._M_head_impl._0_1_ = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                  local_1b0 = (AssertHelperData *)0x0;
                  _Var5._M_head_impl = local_1a8._M_head_impl;
                  if (local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0) goto LAB_0030718b;
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,(AssertionResult *)0x55d606,
                             "false","true",(char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x126,(char *)local_190);
                  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_1a0);
LAB_00307f54:
                  testing::internal::AssertHelper::~AssertHelper(&local_160);
                  if (local_190 != (undefined1  [8])&local_180) {
                    operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
                  }
                  if ((AssertHelperData *)local_1a0.span_.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
                  }
                  if (local_1b0 != (AssertHelperData *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b0);
                  }
                  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
                  this_00 = &local_16a;
                  goto LAB_00307fad;
                }
LAB_0030718b:
                local_150 = (AssertHelperData *)0x0;
                iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)0x0,
                                        (size_t *)&local_150);
                local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,
                             (AssertionResult *)"EVP_PKEY_derive(use_ctx, nullptr, &prk_len)",
                             "false","true",(char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,300,(char *)local_190);
                  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_1a0);
                  goto LAB_00307f54;
                }
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)local_190,"prk_len","test->prk_len",
                           (unsigned_long *)&local_150,(unsigned_long *)(&DAT_00700850 + lVar9));
                if (local_190[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_1b8);
                  pcVar7 = "";
                  if (local_188 != (AssertHelperData *)0x0) {
                    pcVar7 = *(char **)local_188;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_1a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x12d,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_1a0,(Message *)&local_1b8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_head_impl !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
                  }
                }
                if (local_188 != (AssertHelperData *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_188,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_188);
                }
                local_150 = local_38;
                iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                                        (size_t *)&local_150);
                local_1b8._M_head_impl._0_1_ = iVar1 == 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 != 0) {
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,
                             (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","true",
                             "false",(char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x131,(char *)local_190);
                  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_1a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_160);
                  if (local_190 != (undefined1  [8])&local_180) {
                    operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
                  }
                  if ((AssertHelperData *)local_1a0.span_.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
                  }
                }
                if (local_1b0 != (AssertHelperData *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b0);
                }
                ERR_clear_error();
                local_88.message.field_2._8_8_ = 0;
                uStack_50 = 0;
                local_88.message._M_string_length = 0;
                local_88.message.field_2._M_allocated_capacity = 0;
                local_88.line = 0;
                local_88._20_4_ = 0;
                local_88.message._M_dataplus._M_p = (pointer)0x0;
                local_88.type = kSuccess;
                local_88._4_4_ = 0;
                local_88.file = (char *)0x0;
                local_150 = pAVar6;
                iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                                        (size_t *)&local_150);
                local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,
                             (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false",
                             "true",(char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x137,(char *)local_190);
                  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_1a0);
                  goto LAB_00307f54;
                }
                local_1b8._M_head_impl = local_f0._M_head_impl;
                local_1a0.span_.data_ = (uchar *)&local_88;
                local_1a0.span_.size_ = (size_t)local_150;
                local_1b0 = pAVar6;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_190,"Bytes(test->prk, test->prk_len)",
                           "Bytes(prk, prk_len)",(Bytes *)&local_1b8,&local_1a0);
                if (local_190[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_1b8);
                  pcVar7 = "";
                  if (local_188 != (AssertHelperData *)0x0) {
                    pcVar7 = *(char **)local_188;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_1a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x138,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_1a0,(Message *)&local_1b8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_head_impl !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
                  }
                }
                if (local_188 != (AssertHelperData *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_188,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_188);
                }
                local_88.type = kSuccess;
                local_88._4_4_ = 0;
                local_88.file = (char *)0x0;
                local_88.line = 0;
                local_88._20_4_ = 0;
                local_88.message._M_dataplus._M_p = (pointer)0x0;
                local_88.message._M_string_length = 0;
                local_88.message.field_2._M_allocated_capacity = 0;
                local_88.message.field_2._8_8_ = 0;
                uStack_50 = 0;
                local_150 = local_40;
                iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,(uchar *)&local_88,
                                        (size_t *)&local_150);
                local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,
                             (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false",
                             "true",(char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_160,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x13d,(char *)local_190);
                  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_1a0);
                  goto LAB_00307f54;
                }
                local_1b8._M_head_impl = local_f0._M_head_impl;
                local_1a0.span_.data_ = (uchar *)&local_88;
                local_1a0.span_.size_ = (size_t)local_150;
                local_1b0 = pAVar6;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_190,"Bytes(test->prk, test->prk_len)",
                           "Bytes(prk, prk_len)",(Bytes *)&local_1b8,&local_1a0);
                if (local_190[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_1b8);
                  pcVar7 = "";
                  if (local_188 != (AssertHelperData *)0x0) {
                    pcVar7 = *(char **)local_188;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_1a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x13e,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_1a0,(Message *)&local_1b8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_head_impl !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
                  }
                }
                if (local_188 != (AssertHelperData *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_188,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_188);
                }
                std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
                testing::ScopedTrace::~ScopedTrace(&local_16a);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 2);
              pEVar3 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
              _Var5._M_head_impl = local_168._M_head_impl;
              bVar11 = local_168._M_head_impl != (EVP_PKEY_CTX *)0x0;
              local_168._M_head_impl = pEVar3;
              if (bVar11) {
                EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
              }
              local_1b8._M_head_impl._0_1_ = local_168._M_head_impl != (EVP_PKEY_CTX *)0x0;
              local_1b0 = (AssertHelperData *)0x0;
              if (local_168._M_head_impl == (EVP_PKEY_CTX *)0x0) {
                testing::Message::Message((Message *)&local_1a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_190,(internal *)&local_1b8,(AssertionResult *)0x5423a5,
                           "false","true",(char *)puVar8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_1a8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                           ,0x142,(char *)local_190);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
              }
              else {
                iVar1 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_168._M_head_impl);
                local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_1a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_190,(internal *)&local_1b8,
                             (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",
                             (char *)puVar8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_1a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                             ,0x143,(char *)local_190);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                }
                else {
                  iVar1 = EVP_PKEY_CTX_hkdf_mode(local_168._M_head_impl,2);
                  _Var5._M_head_impl = local_168._M_head_impl;
                  local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                  local_1b0 = (AssertHelperData *)0x0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&local_1a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_190,(internal *)&local_1b8,
                               (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 2)","false",
                               "true",(char *)puVar8);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_1a8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                               ,0x145,(char *)local_190);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                  }
                  else {
                    pEVar2 = (EVP_MD *)(*local_138)();
                    iVar1 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar2);
                    local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                    local_1b0 = (AssertHelperData *)0x0;
                    if (iVar1 == 0) {
                      testing::Message::Message((Message *)&local_1a0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_190,(internal *)&local_1b8,
                                 (AssertionResult *)
                                 "EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())","false",
                                 "true",(char *)puVar8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_1a8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                 ,0x146,(char *)local_190);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                    }
                    else {
                      iVar1 = EVP_PKEY_CTX_set1_hkdf_key
                                        (local_168._M_head_impl,(uint8_t *)local_f0._M_head_impl,
                                         (size_t)pAVar6);
                      local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                      local_1b0 = (AssertHelperData *)0x0;
                      if (iVar1 == 0) {
                        testing::Message::Message((Message *)&local_1a0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_190,(internal *)&local_1b8,
                                   (AssertionResult *)
                                   "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len)"
                                   ,"false","true",(char *)puVar8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_1a8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                   ,0x148,(char *)local_190);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                      }
                      else {
                        info_len = local_140 >> 1;
                        iVar1 = EVP_PKEY_CTX_add1_hkdf_info
                                          (local_168._M_head_impl,local_128,info_len);
                        local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                        local_1b0 = (AssertHelperData *)0x0;
                        if (iVar1 == 0) {
                          testing::Message::Message((Message *)&local_1a0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_190,(internal *)&local_1b8,
                                     (AssertionResult *)
                                     "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)",
                                     "false","true",(char *)puVar8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_1a8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                     ,0x14b,(char *)local_190);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                        }
                        else {
                          info = local_128 + info_len;
                          local_140 = local_140 - info_len;
                          iVar1 = EVP_PKEY_CTX_add1_hkdf_info(local_168._M_head_impl,info,local_140)
                          ;
                          local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                          local_1b0 = (AssertHelperData *)0x0;
                          if (iVar1 != 0) {
                            local_152 = 0x100;
                            lVar9 = 0;
LAB_00307706:
                            local_16a = *(ScopedTrace *)((long)&local_152 + lVar9);
                            testing::ScopedTrace::ScopedTrace<bool>
                                      (&local_16b,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                       ,0x14f,(bool *)&local_16a);
                            local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
                            _Var5._M_head_impl = local_168._M_head_impl;
                            if (local_16a == (ScopedTrace)0x1) {
                              pEVar3 = (EVP_PKEY_CTX *)
                                       EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_168._M_head_impl);
                              _Var5._M_head_impl = local_1a8._M_head_impl;
                              bVar11 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                              local_1a8._M_head_impl = pEVar3;
                              if (bVar11) {
                                EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
                              }
                              local_1b8._M_head_impl._0_1_ =
                                   local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                              local_1b0 = (AssertHelperData *)0x0;
                              _Var5._M_head_impl = local_1a8._M_head_impl;
                              if (local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0) goto LAB_0030777a;
                              testing::Message::Message((Message *)&local_1a0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_190,(internal *)&local_1b8,
                                         (AssertionResult *)0x55d606,"false","true",(char *)puVar8);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_160,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                         ,0x154,(char *)local_190);
                              testing::internal::AssertHelper::operator=
                                        (&local_160,(Message *)&local_1a0);
                              pAVar4 = &local_160;
LAB_00308504:
                              testing::internal::AssertHelper::~AssertHelper(pAVar4);
                              if (local_190 != (undefined1  [8])&local_180) {
                                operator_delete((void *)local_190,
                                                local_180._M_allocated_capacity + 1);
                              }
                              if ((AssertHelperData *)local_1a0.span_.data_ !=
                                  (AssertHelperData *)0x0) {
                                (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
                              }
                              if (local_1b0 != (AssertHelperData *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_1b0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_1b0);
                              }
                              std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                         &local_1a8);
                              this_00 = &local_16b;
LAB_00307fad:
                              testing::ScopedTrace::~ScopedTrace(this_00);
                            }
                            else {
LAB_0030777a:
                              local_a8 = 0;
                              uStack_a0 = 0;
                              aStack_c0._8_8_ = 0;
                              uStack_b0 = 0;
                              local_c8 = 0;
                              aStack_c0._M_allocated_capacity = 0;
                              local_d8._M_allocated_capacity = 0;
                              local_d8._8_8_ = (pointer)0x0;
                              local_e8 = (undefined1  [8])0x0;
                              pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)0x0;
                              local_98 = 0;
                              local_160.data_ = local_120;
                              iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,local_e8,
                                                      (size_t *)&local_160);
                              local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                              local_1b0 = (AssertHelperData *)0x0;
                              if (iVar1 == 0) {
                                testing::Message::Message((Message *)&local_1a0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_190,(internal *)&local_1b8,
                                           (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)",
                                           "false","true",(char *)puVar8);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_148,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                           ,0x159,(char *)local_190);
                                testing::internal::AssertHelper::operator=
                                          (&local_148,(Message *)&local_1a0);
                                pAVar4 = &local_148;
                                goto LAB_00308504;
                              }
                              local_1b8._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f8;
                              local_1b0 = local_120;
                              local_1a0.span_.data_ = local_e8;
                              local_1a0.span_.size_ = (size_t)local_160.data_;
                              testing::internal::CmpHelperEQ<Bytes,Bytes>
                                        ((internal *)local_190,"Bytes(test->out, test->out_len)",
                                         "Bytes(buf, len)",(Bytes *)&local_1b8,&local_1a0);
                              if (local_190[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_1b8);
                                pcVar7 = "";
                                if (local_188 != (AssertHelperData *)0x0) {
                                  pcVar7 = *(char **)local_188;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&local_1a0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                           ,0x15a,pcVar7);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&local_1a0,(Message *)&local_1b8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&local_1a0);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1b8._M_head_impl !=
                                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)0x0) {
                                  (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
                                }
                              }
                              if (local_188 != (AssertHelperData *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_188,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_188);
                              }
                              std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)
                                         &local_1a8);
                              testing::ScopedTrace::~ScopedTrace(&local_16b);
                              if (iVar1 != 0) goto code_r0x003078cb;
                            }
                            goto LAB_00307fb2;
                          }
                          testing::Message::Message((Message *)&local_1a0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_190,(internal *)&local_1b8,
                                     (AssertionResult *)
                                     "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                                     ,"false","true",(char *)puVar8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_1a8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                     ,0x14d,(char *)local_190);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0030844f;
code_r0x003078cb:
  lVar9 = lVar9 + 1;
  if (lVar9 == 2) goto LAB_003078d8;
  goto LAB_00307706;
LAB_003078d8:
  pEVar3 = (EVP_PKEY_CTX *)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
  _Var5._M_head_impl = local_168._M_head_impl;
  bVar11 = local_168._M_head_impl != (EVP_PKEY_CTX *)0x0;
  local_168._M_head_impl = pEVar3;
  if (bVar11) {
    EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
  }
  local_1b8._M_head_impl._0_1_ = local_168._M_head_impl != (EVP_PKEY_CTX *)0x0;
  local_1b0 = (AssertHelperData *)0x0;
  if (local_168._M_head_impl == (EVP_PKEY_CTX *)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_190,(internal *)&local_1b8,(AssertionResult *)0x5423a5,"false","true"
               ,(char *)puVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x15e,(char *)local_190);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0);
  }
  else {
    iVar1 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_168._M_head_impl);
    local_1b8._M_head_impl._0_1_ = iVar1 != 0;
    local_1b0 = (AssertHelperData *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_190,(internal *)&local_1b8,
                 (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",(char *)puVar8)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x15f,(char *)local_190);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0);
    }
    else {
      iVar1 = EVP_PKEY_CTX_hkdf_mode(local_168._M_head_impl,0);
      _Var5._M_head_impl = local_168._M_head_impl;
      local_1b8._M_head_impl._0_1_ = iVar1 != 0;
      local_1b0 = (AssertHelperData *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_190,(internal *)&local_1b8,
                   (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 0)","false","true",
                   (char *)puVar8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x161,(char *)local_190);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0)
        ;
      }
      else {
        pEVar2 = (EVP_MD *)(*local_138)();
        iVar1 = EVP_PKEY_CTX_set_hkdf_md(_Var5._M_head_impl,pEVar2);
        local_1b8._M_head_impl._0_1_ = iVar1 != 0;
        local_1b0 = (AssertHelperData *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_190,(internal *)&local_1b8,
                     (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                     "false","true",(char *)puVar8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x162,(char *)local_190);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
        }
        else {
          iVar1 = EVP_PKEY_CTX_set1_hkdf_key(local_168._M_head_impl,local_100,local_108);
          local_1b8._M_head_impl._0_1_ = iVar1 != 0;
          local_1b0 = (AssertHelperData *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_1a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_190,(internal *)&local_1b8,
                       (AssertionResult *)
                       "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false",
                       "true",(char *)puVar8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x164,(char *)local_190);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
          }
          else {
            iVar1 = EVP_PKEY_CTX_set1_hkdf_salt(local_168._M_head_impl,local_118,local_110);
            local_1b8._M_head_impl._0_1_ = iVar1 != 0;
            local_1b0 = (AssertHelperData *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_1a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_190,(internal *)&local_1b8,
                         (AssertionResult *)
                         "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)",
                         "false","true",(char *)puVar8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                         ,0x166,(char *)local_190);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
            }
            else {
              iVar1 = EVP_PKEY_CTX_add1_hkdf_info(local_168._M_head_impl,local_128,info_len);
              local_1b8._M_head_impl._0_1_ = iVar1 != 0;
              local_1b0 = (AssertHelperData *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_1a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_190,(internal *)&local_1b8,
                           (AssertionResult *)
                           "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)","false","true"
                           ,(char *)puVar8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_1a8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                           ,0x168,(char *)local_190);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
              }
              else {
                iVar1 = EVP_PKEY_CTX_add1_hkdf_info(local_168._M_head_impl,info,local_140);
                local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                local_1b0 = (AssertHelperData *)0x0;
                if (iVar1 != 0) {
                  local_152 = 0x100;
                  bVar11 = false;
                  lVar9 = 0;
                  do {
                    local_16a = *(ScopedTrace *)((long)&local_152 + lVar9);
                    testing::ScopedTrace::ScopedTrace<bool>
                              (&local_16b,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                               ,0x16c,(bool *)&local_16a);
                    local_1a8._M_head_impl = (EVP_PKEY_CTX *)0x0;
                    _Var5._M_head_impl = local_168._M_head_impl;
                    if (local_16a == (ScopedTrace)0x1) {
                      pEVar3 = (EVP_PKEY_CTX *)
                               EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_168._M_head_impl);
                      _Var5._M_head_impl = local_1a8._M_head_impl;
                      bVar12 = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                      local_1a8._M_head_impl = pEVar3;
                      if (bVar12) {
                        EVP_PKEY_CTX_free((EVP_PKEY_CTX *)_Var5._M_head_impl);
                      }
                      local_1b8._M_head_impl._0_1_ = local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0;
                      local_1b0 = (AssertHelperData *)0x0;
                      _Var5._M_head_impl = local_1a8._M_head_impl;
                      if (local_1a8._M_head_impl != (EVP_PKEY_CTX *)0x0) goto LAB_00307abe;
                      testing::Message::Message((Message *)&local_1a0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_190,(internal *)&local_1b8,
                                 (AssertionResult *)0x55d606,"false","true",(char *)puVar8);
                      pAVar4 = &local_160;
                      testing::internal::AssertHelper::AssertHelper
                                (pAVar4,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                 ,0x171,(char *)local_190);
                      testing::internal::AssertHelper::operator=(pAVar4,(Message *)&local_1a0);
LAB_00307d1a:
                      testing::internal::AssertHelper::~AssertHelper(pAVar4);
                      if (local_190 != (undefined1  [8])&local_180) {
                        operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
                      }
                      if ((AssertHelperData *)local_1a0.span_.data_ != (AssertHelperData *)0x0) {
                        (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
                      }
                      if (local_1b0 != (AssertHelperData *)0x0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1b0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1b0);
                      }
                      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8)
                      ;
                      testing::ScopedTrace::~ScopedTrace(&local_16b);
LAB_00307d76:
                      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_168)
                      ;
                      testing::ScopedTrace::~ScopedTrace(&local_169);
                      if (!bVar11) {
                        return;
                      }
                      goto LAB_00307db2;
                    }
LAB_00307abe:
                    local_a8 = 0;
                    uStack_a0 = 0;
                    aStack_c0._8_8_ = 0;
                    uStack_b0 = 0;
                    local_c8 = 0;
                    aStack_c0._M_allocated_capacity = 0;
                    local_d8._M_allocated_capacity = 0;
                    local_d8._8_8_ = (pointer)0x0;
                    local_e8 = (undefined1  [8])0x0;
                    pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                    local_98 = 0;
                    local_160.data_ = local_120;
                    iVar1 = EVP_PKEY_derive((EVP_PKEY_CTX *)_Var5._M_head_impl,local_e8,
                                            (size_t *)&local_160);
                    local_1b8._M_head_impl._0_1_ = iVar1 != 0;
                    local_1b0 = (AssertHelperData *)0x0;
                    if (iVar1 == 0) {
                      testing::Message::Message((Message *)&local_1a0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_190,(internal *)&local_1b8,
                                 (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)","false",
                                 "true",(char *)puVar8);
                      pAVar4 = &local_148;
                      testing::internal::AssertHelper::AssertHelper
                                (pAVar4,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                 ,0x176,(char *)local_190);
                      testing::internal::AssertHelper::operator=(pAVar4,(Message *)&local_1a0);
                      goto LAB_00307d1a;
                    }
                    local_1b8._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8;
                    local_1b0 = local_120;
                    local_1a0.span_.data_ = local_e8;
                    local_1a0.span_.size_ = (size_t)local_160.data_;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_190,"Bytes(test->out, test->out_len)",
                               "Bytes(buf, len)",(Bytes *)&local_1b8,&local_1a0);
                    if (local_190[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_1b8);
                      pcVar7 = "";
                      if (local_188 != (AssertHelperData *)0x0) {
                        pcVar7 = *(char **)local_188;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_1a0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                                 ,0x177,pcVar7);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_1a0,(Message *)&local_1b8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b8._M_head_impl !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        (**(code **)(*(size_type *)local_1b8._M_head_impl + 8))();
                      }
                    }
                    if (local_188 != (AssertHelperData *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_188,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_188);
                    }
                    std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_1a8);
                    testing::ScopedTrace::~ScopedTrace(&local_16b);
                    if (iVar1 == 0) goto LAB_00307d76;
                    lVar9 = lVar9 + 1;
                    bVar11 = lVar9 == 2;
                  } while (!bVar11);
                  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_168);
                  testing::ScopedTrace::~ScopedTrace(&local_169);
LAB_00307db2:
                  local_130 = local_130 + 1;
                  if (6 < local_130) {
                    return;
                  }
                  goto LAB_00306c21;
                }
                testing::Message::Message((Message *)&local_1a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_190,(internal *)&local_1b8,
                           (AssertionResult *)
                           "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                           ,"false","true",(char *)puVar8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_1a8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                           ,0x16a,(char *)local_190);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_1a8,(Message *)&local_1a0);
              }
            }
          }
        }
      }
    }
  }
LAB_0030844f:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
  if (local_190 != (undefined1  [8])&local_180) {
    operator_delete((void *)local_190,local_180._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_1a0.span_.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_1a0.span_.data_ + 8))();
  }
  if (local_1b0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
  }
LAB_00307fb2:
  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_168);
LAB_00307fbc:
  testing::ScopedTrace::~ScopedTrace(&local_169);
  return;
}

Assistant:

TEST(HKDFTest, TestVectors) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTests); i++) {
    SCOPED_TRACE(i);
    const HKDFTestVector *test = &kTests[i];

    uint8_t prk[EVP_MAX_MD_SIZE];
    size_t prk_len;
    ASSERT_TRUE(HKDF_extract(prk, &prk_len, test->md_func(), test->ikm,
                             test->ikm_len, test->salt, test->salt_len));
    EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

    uint8_t buf[82];
    ASSERT_TRUE(HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len,
                            test->info, test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    ASSERT_TRUE(HKDF(buf, test->out_len, test->md_func(), test->ikm,
                     test->ikm_len, test->salt, test->salt_len, test->info,
                     test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    // Repeat the test with the OpenSSL compatibility |EVP_PKEY_derive| API.
    bssl::UniquePtr<EVP_PKEY_CTX> ctx(
        EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }

      // A null output should report the length.
      prk_len = 0;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, nullptr, &prk_len));
      EXPECT_EQ(prk_len, test->prk_len);

      // Too small of a buffer should cleanly fail.
      prk_len = test->prk_len - 1;
      EXPECT_FALSE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      ERR_clear_error();

      // Test the correct buffer size.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

      // Test a larger buffer than necessary.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len + 1;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXPAND_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len));
    // |info| can be passed in multiple parts.
    size_t half = test->info_len / 2;
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(EVP_PKEY_CTX_hkdf_mode(ctx.get(),
                                       EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    // |info| can be passed in multiple parts.
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }
  }
}